

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O3

int bandit::run(int argc,char **argv,choice_options *choices,bool allow_further)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  unique_ptr<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
  uVar6;
  controller_t *controller_00;
  undefined7 in_register_00000009;
  controller_t controller;
  options opt;
  vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
  vStack_168;
  controller_t local_150;
  options local_d8;
  
  detail::options::options(&local_d8,argc,argv,choices);
  if (((int)CONCAT71(in_register_00000009,allow_further) == 0) &&
     ((local_d8.has_further_arguments_ != false || (local_d8.has_unknown_options_ == true)))) {
    local_150.context_stack.
    super_deque<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>.
    super__Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>.
    _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&PTR_operator___0011fad8;
    local_150.context_stack.
    super_deque<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>.
    super__Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>.
    _M_impl.super__Deque_impl_data._M_map_size = (size_t)&std::cout;
    option::PrintUsageImplementation::printUsage
              ((IStringWriter *)&local_150,
               local_d8.usage_.
               super__Vector_base<option::Descriptor,_std::allocator<option::Descriptor>_>._M_impl.
               super__Vector_impl_data._M_start,0x50,0x32,0x4b);
    iVar5 = 1;
  }
  else {
    detail::controller_t::controller_t(&local_150);
    bVar4 = detail::options::update_controller_settings(&local_d8,&local_150);
    iVar5 = 1;
    if (bVar4) {
      uVar6._M_t.
      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
      ._M_t.
      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
           (__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
            )operator_new(0x30);
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::vector(&vStack_168,&local_d8.filter_chain_);
      pDVar1 = local_d8.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>
               ._M_impl.super__Vector_impl_data._M_start[8].desc;
      pDVar2 = local_d8.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>
               ._M_impl.super__Vector_impl_data._M_start[9].desc;
      *(bool *)((long)uVar6._M_t.
                      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl +
               8) = false;
      *(undefined ***)
       uVar6._M_t.
       super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
       ._M_t.
       super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
       .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
           &PTR__bandit_0011fbc0;
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::vector((vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
                *)((long)uVar6._M_t.
                         super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                         .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl
                  + 0x10),&vStack_168);
      *(bool *)((long)uVar6._M_t.
                      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl +
               0x28) = pDVar1 != (Descriptor *)0x0;
      *(bool *)((long)uVar6._M_t.
                      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl +
               0x29) = pDVar2 != (Descriptor *)0x0;
      if ((_Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
           )local_150.run_policy._M_t.
            super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
            ._M_t.
            super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
            .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl !=
          (interface *)0x0) {
        lVar3 = *(long *)local_150.run_policy._M_t.
                         super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                         .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl
        ;
        local_150.run_policy._M_t.
        super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
        .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
             uVar6._M_t.
             super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
             ._M_t.
             super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
             .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl;
        (**(code **)(lVar3 + 8))();
        uVar6._M_t.
        super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
        .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
             (__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
              )(__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
                )local_150.run_policy;
      }
      local_150.run_policy._M_t.
      super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
      ._M_t.
      super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
      .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
           (__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
            )(__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
              )uVar6;
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::~vector(&vStack_168);
      detail::controller_t::get_controller_address()::controller_ = &local_150;
      if (detail::specs[abi:cxx11]()::registry_abi_cxx11_ == '\0') {
        run();
      }
      controller_00 = detail::controller_t::registered_controller();
      iVar5 = run(&local_d8,(spec_registry *)detail::specs[abi:cxx11]()::registry_abi_cxx11_,
                  controller_00);
    }
    if ((_Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
         )local_150.run_policy._M_t.
          super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
          .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl !=
        (interface *)0x0) {
      (**(code **)(*(long *)local_150.run_policy._M_t.
                            super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
                            .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>.
                            _M_head_impl + 8))();
    }
    local_150.run_policy._M_t.
    super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
    .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl =
         (__uniq_ptr_data<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>,_true,_true>
          )(__uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
            )0x0;
    if ((_Head_base<0UL,_bandit::reporter::interface_*,_false>)
        local_150.reporter._M_t.
        super___uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::reporter::interface_*,_std::default_delete<bandit::reporter::interface>_>
        .super__Head_base<0UL,_bandit::reporter::interface_*,_false>._M_head_impl !=
        (_Head_base<0UL,_bandit::reporter::interface_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_150.reporter._M_t.
          super___uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_bandit::reporter::interface_*,_std::default_delete<bandit::reporter::interface>_>
          .super__Head_base<0UL,_bandit::reporter::interface_*,_false>._M_head_impl)[1])();
    }
    local_150.reporter._M_t.
    super___uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::reporter::interface_*,_std::default_delete<bandit::reporter::interface>_>
    .super__Head_base<0UL,_bandit::reporter::interface_*,_false>._M_head_impl =
         (__uniq_ptr_data<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>,_true,_true>
          )(__uniq_ptr_impl<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>
            )0x0;
    if (local_150.formatter._M_t.
        super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
        .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
         )0x0) {
      (*(*(_func_int ***)
          local_150.formatter._M_t.
          super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
          .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl)[1])();
    }
    local_150.formatter._M_t.
    super___uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::failure_formatter::interface_*,_std::default_delete<bandit::failure_formatter::interface>_>
    .super__Head_base<0UL,_bandit::failure_formatter::interface_*,_false>._M_head_impl =
         (__uniq_ptr_data<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>,_true,_true>
          )(__uniq_ptr_impl<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
            )0x0;
    if (local_150.colorizer._M_t.
        super___uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::colorizer::interface_*,_std::default_delete<bandit::colorizer::interface>_>
        .super__Head_base<0UL,_bandit::colorizer::interface_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
         )0x0) {
      (*(*(_func_int ***)
          local_150.colorizer._M_t.
          super___uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_bandit::colorizer::interface_*,_std::default_delete<bandit::colorizer::interface>_>
          .super__Head_base<0UL,_bandit::colorizer::interface_*,_false>._M_head_impl)[1])();
    }
    local_150.colorizer._M_t.
    super___uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::colorizer::interface_*,_std::default_delete<bandit::colorizer::interface>_>
    .super__Head_base<0UL,_bandit::colorizer::interface_*,_false>._M_head_impl =
         (__uniq_ptr_data<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>,_true,_true>
          )(__uniq_ptr_impl<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
            )0x0;
    if ((tuple<bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>)
        local_150.adapter._M_t.
        super___uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>
        .super__Head_base<0UL,_bandit::adapter::interface_*,_false>._M_head_impl !=
        (_Head_base<0UL,_bandit::adapter::interface_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_150.adapter._M_t.
          super___uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>
          .super__Head_base<0UL,_bandit::adapter::interface_*,_false>._M_head_impl)[1])();
    }
    local_150.adapter._M_t.
    super___uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::adapter::interface_*,_std::default_delete<bandit::adapter::interface>_>
    .super__Head_base<0UL,_bandit::adapter::interface_*,_false>._M_head_impl =
         (__uniq_ptr_data<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>,_true,_true>
          )(__uniq_ptr_impl<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>
            )0x0;
    std::_Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>::
    ~_Deque_base((_Deque_base<bandit::context::interface_*,_std::allocator<bandit::context::interface_*>_>
                  *)&local_150);
  }
  detail::options::~options(&local_d8);
  return iVar5;
}

Assistant:

inline int run(int argc, char* argv[], const detail::choice_options& choices, bool allow_further = true) {
    detail::options opt(argc, argv, choices);

    if (!allow_further &&
        (opt.has_further_arguments() || opt.has_unknown_options())) {
      opt.print_usage();
      return 1;
    }

    detail::controller_t controller;
    if (!opt.update_controller_settings(controller)) {
      return 1;
    }

    controller.set_policy(new run_policy::bandit(opt.filter_chain(), opt.break_on_failure(), opt.dry_run()));

    detail::register_controller(&controller);
    return run(opt, detail::specs());
  }